

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O2

void __thiscall wire::string::string<unsigned_int>(string *this,uint *t)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  undefined1 local_188 [376];
  
  (this->super_string)._M_dataplus._M_p = (pointer)&(this->super_string).field_2;
  (this->super_string)._M_string_length = 0;
  (this->super_string).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  if (((byte)poVar1[*(long *)(*(long *)poVar1 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)this,asStack_1b8);
    std::__cxx11::string::~string(asStack_1b8);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

string( const T &t ) : std::string()
        {
            std::stringstream ss;
            if( ss << /* std::boolalpha << */ t )
                this->assign( ss.str() );
        }